

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileWriterTests.cpp
# Opt level: O2

int testFileWriterTestsReadData(void)

{
  string *psVar1;
  ostream *poVar2;
  SpanSize<18446744073709551615UL> in_RCX;
  char *pcVar3;
  Span<unsigned_char,_18446744073709551615UL> data;
  Span<unsigned_char,_18446744073709551615UL> destData;
  Span<unsigned_char,_18446744073709551615UL> destData_00;
  Span<unsigned_char,_18446744073709551615UL> destData_01;
  data data1;
  data_p2 out2;
  data_p1 out1;
  AutoDeleteTempFile tempfile;
  FileWriter writer;
  
  MILBlob::TestUtil::AutoDeleteTempFile::AutoDeleteTempFile(&tempfile);
  data1.a = 'b';
  data1.b = 0x17;
  data1.c = 0.234513;
  data1.d = 's';
  psVar1 = MILBlob::TestUtil::AutoDeleteTempFile::GetFilename_abi_cxx11_(&tempfile);
  data.m_size.m_size = in_RCX.m_size;
  data.m_ptr = (pointer)0x10;
  MILBlob::TestUtil::WriteBlobFile<unsigned_char,18446744073709551615ul>
            ((TestUtil *)psVar1,(string *)&data1,data);
  psVar1 = MILBlob::TestUtil::AutoDeleteTempFile::GetFilename_abi_cxx11_(&tempfile);
  MILBlob::Blob::FileWriter::FileWriter(&writer,psVar1,false);
  destData.m_size.m_size = 8;
  destData.m_ptr = (pointer)&out1;
  MILBlob::Blob::FileWriter::ReadData(&writer,0,destData);
  destData_00.m_size.m_size = 8;
  destData_00.m_ptr = (pointer)&out2;
  MILBlob::Blob::FileWriter::ReadData(&writer,8,destData_00);
  if (data1.a == out1.a) {
    if (data1.b == out1.b) {
      if ((data1.c != out2.c) || (NAN(data1.c) || NAN(out2.c))) {
        poVar2 = std::operator<<((ostream *)&std::cout,
                                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/MILBlob/FileWriterTests.cpp"
                                );
        poVar2 = std::operator<<(poVar2,":");
        poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0xbe);
        poVar2 = std::operator<<(poVar2,": error: ");
        pcVar3 = "(data1.c) == (out2.c)";
      }
      else {
        if (data1.d == out2.d) {
          destData_01.m_size.m_size = 0x10;
          destData_01.m_ptr = (pointer)&data1;
          MILBlob::Blob::FileWriter::ReadData(&writer,8,destData_01);
          poVar2 = std::operator<<((ostream *)&std::clog,
                                   "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/MILBlob/FileWriterTests.cpp"
                                  );
          poVar2 = std::operator<<(poVar2,":");
          poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0xc4);
          std::operator<<(poVar2,": expected exception, but none thrown.\n");
          goto LAB_00174602;
        }
        poVar2 = std::operator<<((ostream *)&std::cout,
                                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/MILBlob/FileWriterTests.cpp"
                                );
        poVar2 = std::operator<<(poVar2,":");
        poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0xbf);
        poVar2 = std::operator<<(poVar2,": error: ");
        pcVar3 = "(data1.d) == (out2.d)";
      }
    }
    else {
      poVar2 = std::operator<<((ostream *)&std::cout,
                               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/MILBlob/FileWriterTests.cpp"
                              );
      poVar2 = std::operator<<(poVar2,":");
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0xbd);
      poVar2 = std::operator<<(poVar2,": error: ");
      pcVar3 = "(data1.b) == (out1.b)";
    }
  }
  else {
    poVar2 = std::operator<<((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/MILBlob/FileWriterTests.cpp"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0xbc);
    poVar2 = std::operator<<(poVar2,": error: ");
    pcVar3 = "(data1.a) == (out1.a)";
  }
  poVar2 = std::operator<<(poVar2,pcVar3);
  poVar2 = std::operator<<(poVar2," was false, expected true.");
  std::endl<char,std::char_traits<char>>(poVar2);
LAB_00174602:
  MILBlob::Blob::FileWriter::~FileWriter(&writer);
  MILBlob::TestUtil::AutoDeleteTempFile::~AutoDeleteTempFile(&tempfile);
  return 1;
}

Assistant:

int testFileWriterTestsReadData()
{
    AutoDeleteTempFile tempfile;
    // Reading Data from file via Writer
    {
        struct data {
            char a;
            int b;
            float c;
            char d;
        };

        struct data_p1 {
            char a;
            int b;
        };

        struct data_p2 {
            float c;
            char d;
        };

        data data1;
        data1.a = 'b';
        data1.b = 23;
        data1.c = 0.234513f;
        data1.d = 's';

        data_p1 out1;
        data_p2 out2;

        uint64_t offset1 = 0;
        uint64_t offset2 = sizeof(out1);
        {
            TestUtil::WriteBlobFile(tempfile.GetFilename(), CastAndMakeSpan(data1));
        }

        FileWriter writer(tempfile.GetFilename(), /* truncateFile */ false);

        writer.ReadData(offset1, CastAndMakeSpan(out1));
        writer.ReadData(offset2, CastAndMakeSpan(out2));

        // Validate data
        ML_ASSERT_EQ(data1.a, out1.a);
        ML_ASSERT_EQ(data1.b, out1.b);
        ML_ASSERT_EQ(data1.c, out2.c);
        ML_ASSERT_EQ(data1.d, out2.d);

        // Unable to read data i.e. reached end of file
        ML_ASSERT_THROWS_WITH_MESSAGE(writer.ReadData(offset2, CastAndMakeSpan(data1)),
                                      std::runtime_error,
                                      "Unknown error occurred while reading data from the file.");
    }

    return 0;
}